

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

void REVextract_attr_list_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  CMFormat format;
  attr_list p_Var1;
  EV_string_response response;
  undefined4 local_30 [2];
  void *local_28;
  
  format = CMlookup_format(conn->cm,EV_string_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_string_response_formats);
  }
  p_Var1 = EVextract_attr_list(cm,*(EVstone *)((long)data + 4));
  local_28 = (void *)attr_list_to_string(p_Var1);
  local_30[0] = *data;
  CMwrite(conn,format,local_30);
  free(local_28);
  return;
}

Assistant:

static void
REVextract_attr_list_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_string_response response;
    EVextract_attr_list_request *request = (EVextract_attr_list_request *) data;
    attr_list ret;
    CMFormat f = CMlookup_format(conn->cm, EV_string_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_string_response_formats);
    }
    ret = EVextract_attr_list(cm, request->stone_id);
    response.ret = attr_list_to_string(ret);
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
    free(response.ret);
}